

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_vumeter.c
# Opt level: O2

void vu_draw_update(t_gobj *client,_glist *glist)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined8 in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _glist *p_Var8;
  undefined8 extraout_RAX;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  char local_b8 [136];
  undefined8 uVar7;
  
  p_Var8 = (_glist *)CONCAT71((int7)((ulong)in_RAX >> 8),*(byte *)&client[0x4b].g_next);
  if ((*(byte *)&client[0x4b].g_next & 1) != 0) {
    iVar2 = glist_isvisible(glist);
    uVar7 = CONCAT44(extraout_var,iVar2);
    if (iVar2 != 0) {
      iVar2 = *(int *)((long)&client[3].g_pd[1].c_floatmethod + 4);
      iVar9 = *(int *)((long)&client[4].g_pd + 4) / 4;
      iVar3 = text_ypix((t_text *)client,glist);
      iVar4 = text_xpix((t_text *)client,glist);
      iVar1 = *(int *)((long)&client[4].g_pd + 4);
      iVar5 = sprintf(local_b8,"%lxRCOVER",client);
      p_Var8 = glist_getcanvas((_glist *)CONCAT44(extraout_var_00,iVar5));
      pdgui_vmess((char *)0x0,"crs iiii",p_Var8,"coords",local_b8,
                  (ulong)(uint)((iVar9 - iVar2) + iVar4),(ulong)(uint)(iVar3 - iVar2),
                  (ulong)(uint)((iVar2 - iVar9) + iVar4 + iVar1),
                  (ulong)(uint)((0x28 - *(int *)&client[0x49].g_next) *
                                (*(int *)&client[0x49].g_pd + 1) * iVar2 + (iVar3 - iVar2)));
      uVar7 = extraout_RAX;
    }
    p_Var8 = (_glist *)
             (CONCAT71((int7)((ulong)uVar7 >> 8),*(undefined1 *)&client[0x4b].g_next) &
             0xfffffffffffffffe);
    *(char *)&client[0x4b].g_next = (char)p_Var8;
  }
  if (((ulong)p_Var8 & 2) != 0) {
    p_Var8 = glist_getcanvas(p_Var8);
    iVar2 = glist_isvisible(glist);
    if (iVar2 != 0) {
      iVar2 = *(int *)((long)&client[3].g_pd[1].c_floatmethod + 4);
      uVar6 = text_xpix((t_text *)client,glist);
      iVar3 = text_ypix((t_text *)client,glist);
      sprintf(local_b8,"%lxPLED",client);
      iVar1 = *(int *)((long)&client[0x49].g_pd + 4);
      if ((long)iVar1 == 0) {
        uVar10 = (ulong)(*(int *)((long)&client[4].g_pd + 4) / 2 + uVar6);
        pdgui_vmess((char *)0x0,"crs rk",p_Var8,"itemconfigure",local_b8,"-fill",
                    (ulong)*(uint *)&client[0x45].g_pd);
        uVar11 = (ulong)(uint)(iVar3 + iVar2 * 10);
        pdgui_vmess((char *)0x0,"crs iiii",p_Var8,"coords",local_b8,uVar10,uVar11,uVar10,uVar11);
      }
      else {
        iVar4 = iemgui_vu_col[iVar1];
        iVar5 = (*(int *)&client[0x49].g_pd + 1) * iVar2;
        uVar10 = (ulong)(uint)(iVar5 / -2 + (0x29 - iVar1) * iVar5 + iVar3);
        pdgui_vmess((char *)0x0,"crs iiii",p_Var8,"coords",local_b8,(ulong)uVar6,uVar10,
                    (ulong)(uVar6 + iVar2 + *(int *)((long)&client[4].g_pd + 4)),uVar10);
        pdgui_vmess((char *)0x0,"crs rk",p_Var8,"itemconfigure",local_b8,"-fill",
                    (ulong)(uint)iemgui_color_hex[iVar4]);
      }
    }
    *(byte *)&client[0x4b].g_next = *(byte *)&client[0x4b].g_next & 0xfd;
  }
  return;
}

Assistant:

static void vu_draw_update(t_gobj *client, t_glist *glist)
{
    t_vu *x = (t_vu *)client;
    if (x->x_updaterms)
    {
        vu_update_rms(x, glist);
        x->x_updaterms = 0;
    }
    if (x->x_updatepeak)
    {
        vu_update_peak(x, glist);
        x->x_updatepeak = 0;
    }
}